

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::to_string<char,char>(string *__return_storage_ptr__,lest *this,char *lhs,string *op,char *rhs)

{
  ostream *poVar1;
  char chr;
  char chr_00;
  ostringstream os;
  string sStack_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  make_char_string_abi_cxx11_(&local_1b8,(lest *)(ulong)(uint)(int)(char)*this,chr);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  make_char_string_abi_cxx11_
            (&sStack_1d8,(lest *)(ulong)(uint)(int)*(char *)&(op->_M_dataplus)._M_p,chr_00);
  std::operator<<(poVar1,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}